

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O2

void __thiscall gss::innards::Proof::need_elimination(Proof *this,int p,int t)

{
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var1;
  bool bVar2;
  ostream *poVar3;
  mapped_type *pmVar4;
  mapped_type_conflict *pmVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  key_type local_38;
  
  lVar6 = (long)p;
  lVar7 = (long)t;
  local_38.first = lVar6;
  local_38.second = lVar7;
  bVar2 = std::
          map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
          ::contains(&((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                      eliminations,&local_38);
  if (!bVar2) {
    std::operator<<((ostream *)
                    (((this->_imp)._M_t.
                      super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                      .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                    proof_stream)._M_t,"# 0\n");
    poVar3 = std::operator<<((ostream *)
                             (((this->_imp)._M_t.
                               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                              _M_head_impl)->proof_stream)._M_t,"u 1 ~x");
    local_38.first = lVar6;
    local_38.second = lVar7;
    pmVar4 = std::
             map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&((this->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                            .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->variable_mappings,&local_38);
    poVar3 = std::operator<<(poVar3,(string *)pmVar4);
    std::operator<<(poVar3," >= 1 ;\n");
    _Var1._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
    lVar8 = (_Var1._M_head_impl)->proof_line + 1;
    (_Var1._M_head_impl)->proof_line = lVar8;
    local_38.first = lVar6;
    local_38.second = lVar7;
    pmVar5 = std::
             map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
             ::operator[](&(_Var1._M_head_impl)->eliminations,&local_38);
    *pmVar5 = lVar8;
    poVar3 = std::operator<<((ostream *)
                             (((this->_imp)._M_t.
                               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                              _M_head_impl)->proof_stream)._M_t,"# ");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar3,
                        ((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                        active_level);
    std::operator<<(poVar3,'\n');
  }
  return;
}

Assistant:

auto Proof::need_elimination(int p, int t) -> void
{
    if (! _imp->eliminations.contains(pair{p, t})) {
        *_imp->proof_stream << "# 0\n";
        *_imp->proof_stream << "u 1 ~x" << _imp->variable_mappings[pair{p, t}] << " >= 1 ;\n";
        _imp->eliminations[pair{p, t}] = ++_imp->proof_line;
        *_imp->proof_stream << "# " << _imp->active_level << '\n';
    }
}